

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Nullability __thiscall wasm::TranslateToFuzzReader::getNullability(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  
  if (((this->wasm->features).features & 0x400) != 0) {
    uVar1 = Random::upTo(&this->random,2);
    if (uVar1 == 0) {
      return NonNullable;
    }
  }
  return Nullable;
}

Assistant:

Nullability TranslateToFuzzReader::getNullability() {
  // Without wasm GC, avoid non-nullable types as we cannot create any values
  // of such types. For example, reference types adds eqref, but there is no
  // way to create such a value, only to receive it from the outside, while GC
  // adds i31/struct/array creation. Without GC, we will likely need to create a
  // null of this type (unless we are lucky enough to have a non-null value
  // arriving from an import), so avoid a non-null type if possible.
  if (wasm.features.hasGC() && oneIn(2)) {
    return NonNullable;
  }
  return Nullable;
}